

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *fname;
  MOJOSHADER_error *pMVar1;
  MOJOSHADER_effectObject *pMVar2;
  char *pcVar3;
  FILE *__stream;
  uchar *tokenbuf;
  size_t sVar4;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_parseData *pd;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  MOJOSHADER_effectTechnique *pMVar10;
  char *pcVar11;
  ulong uVar12;
  MOJOSHADER_effectParam *value;
  uint uVar13;
  MOJOSHADER_effectState *pMVar14;
  ulong uVar15;
  int i;
  long lVar16;
  ulong uVar17;
  MOJOSHADER_effectPass *pMVar18;
  int iVar19;
  
  puts("MojoShader testparse");
  printf("Compiled against changeset %s\n","???");
  pcVar3 = MOJOSHADER_changeset();
  printf("Linked against changeset %s\n",pcVar3);
  putchar(10);
  if (argc < 3) {
    iVar6 = 0;
    printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n",*argv);
  }
  else {
    pcVar3 = argv[1];
    uVar12 = 2;
    iVar6 = 0;
    do {
      __stream = fopen(argv[uVar12],"rb");
      if (__stream == (FILE *)0x0) {
        printf(" ... fopen(\'%s\') failed.\n",argv[uVar12]);
      }
      else {
        tokenbuf = (uchar *)malloc(1000000);
        sVar4 = fread(tokenbuf,1,1000000,__stream);
        fclose(__stream);
        fname = argv[uVar12];
        if (*tokenbuf == 0xcf) {
          if (((tokenbuf[1] == '\v') && (tokenbuf[2] == 0xf0)) && (tokenbuf[3] == 0xbc))
          goto LAB_00107465;
LAB_00107546:
          pd = MOJOSHADER_parse(pcVar3,(char *)0x0,tokenbuf,(uint)sVar4,(MOJOSHADER_swizzle *)0x0,0,
                                (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                                (MOJOSHADER_free)0x0,(void *)0x0);
          iVar19 = pd->error_count;
          printf("SHADER: %s\n",fname);
          print_shader(fname,pd,1);
          MOJOSHADER_freeParseData(pd);
        }
        else {
          if (((*tokenbuf != '\x01') || (tokenbuf[1] != '\t')) ||
             ((tokenbuf[2] != 0xff || (tokenbuf[3] != 0xfe)))) goto LAB_00107546;
LAB_00107465:
          _effect = MOJOSHADER_parseEffect
                              (pcVar3,tokenbuf,(uint)sVar4,(MOJOSHADER_swizzle *)0x0,0,
                               (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                               (MOJOSHADER_free)0x0,(void *)0x0);
          iVar19 = _effect->error_count;
          printf("EFFECT: %s\n",fname);
          printf("    ");
          printf("PROFILE: %s\n",_effect->profile);
          putchar(10);
          if (_effect->error_count < 1) {
            pMVar10 = _effect->techniques;
            pMVar2 = _effect->objects;
            if (0 < _effect->param_count) {
              value = _effect->params;
              uVar15 = 0;
              do {
                printf("    ");
                printf("PARAM #%d\n",uVar15);
                print_value(&value->value,2);
                if (value->annotation_count != 0) {
                  iVar7 = 2;
                  do {
                    printf("    ");
                    iVar7 = iVar7 + -1;
                  } while (iVar7 != 0);
                  puts("ANNOTATIONS:");
                }
                if (value->annotation_count != 0) {
                  lVar9 = 0;
                  uVar17 = 0;
                  do {
                    print_value((MOJOSHADER_effectValue *)((long)&value->annotations->name + lVar9),
                                3);
                    uVar17 = uVar17 + 1;
                    lVar9 = lVar9 + 0x40;
                  } while (uVar17 < value->annotation_count);
                }
                uVar13 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar13;
                value = value + 1;
              } while ((int)uVar13 < _effect->param_count);
            }
            putchar(10);
            if (0 < _effect->technique_count) {
              uVar13 = 0;
              do {
                pMVar18 = pMVar10->passes;
                printf("    ");
                printf("TECHNIQUE #%d (\'%s\'):\n",(ulong)uVar13,pMVar10->name);
                if (pMVar10->pass_count != 0) {
                  uVar15 = 0;
                  do {
                    pMVar14 = pMVar18->states;
                    iVar7 = 2;
                    do {
                      printf("    ");
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                    printf("PASS #%d (\'%s\'):\n",uVar15,pMVar18->name);
                    if (pMVar18->state_count != 0) {
                      uVar8 = 0;
                      do {
                        iVar7 = 3;
                        do {
                          printf("    ");
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                        printf("STATE %d:\n",(ulong)pMVar14->type);
                        print_value(&pMVar14->value,4);
                        uVar8 = uVar8 + 1;
                        pMVar14 = pMVar14 + 1;
                      } while (uVar8 < pMVar18->state_count);
                    }
                    uVar8 = (int)uVar15 + 1;
                    uVar15 = (ulong)uVar8;
                    pMVar18 = pMVar18 + 1;
                  } while (uVar8 < pMVar10->pass_count);
                }
                uVar13 = uVar13 + 1;
                pMVar10 = pMVar10 + 1;
              } while ((int)uVar13 < _effect->technique_count);
            }
            putchar(10);
            if (1 < _effect->object_count) {
              uVar15 = 1;
              do {
                printf("    ");
                switch(pMVar2[1].type) {
                case MOJOSHADER_SYMTYPE_STRING:
                  uVar5 = *(undefined8 *)((long)pMVar2 + 0x50);
                  pcVar11 = "OBJECT #%d: STRING, \'%s\'\n";
                  goto LAB_00107827;
                case MOJOSHADER_SYMTYPE_TEXTURE:
                case MOJOSHADER_SYMTYPE_TEXTURE1D:
                case MOJOSHADER_SYMTYPE_TEXTURE2D:
                case MOJOSHADER_SYMTYPE_TEXTURE3D:
                case MOJOSHADER_SYMTYPE_TEXTURECUBE:
                  printf("OBJECT #%d: TEXTURE\n",uVar15);
                  break;
                case MOJOSHADER_SYMTYPE_SAMPLER:
                case MOJOSHADER_SYMTYPE_SAMPLER1D:
                case MOJOSHADER_SYMTYPE_SAMPLER2D:
                case MOJOSHADER_SYMTYPE_SAMPLER3D:
                case MOJOSHADER_SYMTYPE_SAMPLERCUBE:
                  uVar5 = *(undefined8 *)((long)pMVar2 + 0x50);
                  pcVar11 = "OBJECT #%d: MAPPING, \'%s\'\n";
LAB_00107827:
                  printf(pcVar11,uVar15,uVar5);
                  break;
                case MOJOSHADER_SYMTYPE_PIXELSHADER:
                case MOJOSHADER_SYMTYPE_VERTEXSHADER:
                  if (*(int *)((long)pMVar2 + 0x54) == 0) {
                    printf("OBJECT #%d: SHADER, technique %u, pass %u\n",uVar15,
                           (ulong)*(uint *)((long)pMVar2 + 0x4c),
                           (ulong)*(uint *)((long)pMVar2 + 0x50));
                    print_shader(fname,*(MOJOSHADER_parseData **)((long)pMVar2 + 0x88),2);
                  }
                  else {
                    printf("OBJECT #%d: PRESHADER, technique %u, pass %u, param %s\n",uVar15,
                           (ulong)*(uint *)((long)pMVar2 + 0x4c),
                           (ulong)*(uint *)((long)pMVar2 + 0x50));
                    print_preshader(*(MOJOSHADER_preshader **)((long)pMVar2 + 0x88),2);
                  }
                  break;
                default:
                  printf("UNKNOWN OBJECT: #%d\n",uVar15);
                }
                uVar13 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar13;
                pMVar2 = pMVar2 + 1;
              } while ((int)uVar13 < _effect->object_count);
            }
          }
          else {
            lVar9 = 0x10;
            lVar16 = 0;
            do {
              pMVar1 = _effect->errors;
              printf("    ");
              pcVar11 = *(char **)((long)pMVar1 + lVar9 + -8);
              if (pcVar11 == (char *)0x0) {
                pcVar11 = fname;
              }
              printf("%s:%d: ERROR: %s\n",pcVar11,(ulong)*(uint *)((long)&pMVar1->error + lVar9),
                     *(undefined8 *)((long)pMVar1 + lVar9 + -0x10));
              lVar16 = lVar16 + 1;
              lVar9 = lVar9 + 0x18;
            } while (lVar16 < _effect->error_count);
          }
          MOJOSHADER_freeEffect(_effect);
        }
        if (iVar19 != 0) {
          iVar6 = 1;
        }
        free(tokenbuf);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)argc);
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    int retval = 0;

    printf("MojoShader testparse\n");
    printf("Compiled against changeset %s\n", MOJOSHADER_CHANGESET);
    printf("Linked against changeset %s\n", MOJOSHADER_changeset());
    printf("\n");

    if (argc <= 2)
        printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n", argv[0]);
    else
    {
        const char *profile = argv[1];
        int i;

        for (i = 2; i < argc; i++)
        {
            FILE *io = fopen(argv[i], "rb");
            if (io == NULL)
                printf(" ... fopen('%s') failed.\n", argv[i]);
            else
            {
                unsigned char *buf = (unsigned char *) malloc(1000000);
                int rc = fread(buf, 1, 1000000, io);
                fclose(io);
                if (!do_parse(argv[i], buf, rc, profile))
                    retval = 1;
                free(buf);
            } // else
        } // for
    } // else

    return retval;
}